

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void remarkupvals(global_State *g)

{
  int iVar1;
  uint uVar2;
  GCObject *pGVar3;
  GCObject *local_28;
  UpVal *uv;
  lua_State **p;
  lua_State *thread;
  global_State *g_local;
  
  uv = (UpVal *)&g->twups;
  while (pGVar3 = (GCObject *)uv->v, pGVar3 != (GCObject *)0x0) {
    if (((pGVar3->marked & 7) == 0) && ((((TValue *)(pGVar3 + 4))->value_).gc != (GCObject *)0x0)) {
      uv = (UpVal *)(pGVar3 + 5);
    }
    else {
      uv->v = (TValue *)((TValue *)(pGVar3 + 5))->value_;
      (((TValue *)(pGVar3 + 5))->value_).gc = pGVar3;
      for (local_28 = pGVar3[4].next; local_28 != (GCObject *)0x0; local_28 = local_28[1].next) {
        iVar1._0_1_ = local_28[1].tt;
        iVar1._1_1_ = local_28[1].marked;
        iVar1._2_2_ = *(undefined2 *)&local_28[1].field_0xa;
        if (iVar1 != 0) {
          pGVar3 = local_28->next;
          uVar2._0_1_ = pGVar3->tt;
          uVar2._1_1_ = pGVar3->marked;
          uVar2._2_2_ = *(undefined2 *)&pGVar3->field_0xa;
          if (((uVar2 & 0x40) != 0) && ((local_28->next->next->marked & 3) != 0)) {
            reallymarkobject(g,local_28->next->next);
          }
          local_28[1].tt = '\0';
          local_28[1].marked = '\0';
          *(undefined2 *)&local_28[1].field_0xa = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void remarkupvals (global_State *g) {
  lua_State *thread;
  lua_State **p = &g->twups;
  while ((thread = *p) != NULL) {
    lua_assert(!isblack(thread));  /* threads are never black */
    if (isgray(thread) && thread->openupval != NULL)
      p = &thread->twups;  /* keep marked thread with upvalues in the list */
    else {  /* thread is not marked or without upvalues */
      UpVal *uv;
      *p = thread->twups;  /* remove thread from the list */
      thread->twups = thread;  /* mark that it is out of list */
      for (uv = thread->openupval; uv != NULL; uv = uv->u.open.next) {
        if (uv->u.open.touched) {
          markvalue(g, uv->v);  /* remark upvalue's value */
          uv->u.open.touched = 0;
        }
      }
    }
  }
}